

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peeker.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::xpression_peeker<char>::
set_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          (xpression_peeker<char> *this,
          regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  bool bVar1;
  cpp_regex_traits<char> *in_RSI;
  cpp_regex_traits<char> *in_RDI;
  
  if (*(void **)((long)(in_RDI->super_cpp_regex_traits_base<char,_1UL>).masks_ + 0x28) ==
      (void *)0x0) {
    *(cpp_regex_traits<char> **)
     ((long)(in_RDI->super_cpp_regex_traits_base<char,_1UL>).masks_ + 0x28) = in_RSI;
    *(pointer_____offset_0x10___ **)
     ((long)(in_RDI->super_cpp_regex_traits_base<char,_1UL>).masks_ + 0x30) =
         &regex_traits<char,boost::xpressive::cpp_regex_traits<char>>::typeinfo;
  }
  else {
    bVar1 = std::type_info::operator!=((type_info *)in_RSI,(type_info *)in_RDI);
    if (!bVar1) {
      get_traits_<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                ((xpression_peeker<char> *)in_RDI);
      bVar1 = cpp_regex_traits<char>::operator!=(in_RSI,in_RDI);
      if (!bVar1) {
        return;
      }
    }
    fail((xpression_peeker<char> *)0x17d7b6);
  }
  return;
}

Assistant:

void set_traits(Traits const &tr)
    {
        if(0 == this->traits_)
        {
            this->traits_ = &tr;
            this->traits_type_ = &typeid(Traits);
        }
        else if(*this->traits_type_ != typeid(Traits) || this->get_traits_<Traits>() != tr)
        {
            this->fail(); // traits mis-match! set all and bail
        }
    }